

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_z.cpp
# Opt level: O3

void zrotg(complex<double> *ca,complex<double> cb,double *c,complex<double> *s)

{
  double in_XMM0_Qa;
  double dVar3;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  complex<double> z;
  complex<double> z_00;
  complex<double> z_01;
  complex<double> z_02;
  complex<double> z_03;
  complex<double> z_04;
  complex<double> z_05;
  double local_78;
  double local_70;
  double local_68;
  ulong local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double *pdVar1;
  complex<double> *pcVar2;
  
  z._M_value._8_8_ = cb._M_value._0_8_;
  z._M_value._0_8_ = ca;
  pdVar1 = z._M_value._8_8_;
  pcVar2 = ca;
  local_58 = in_XMM1_Da;
  uStack_54 = in_XMM1_Db;
  local_38 = in_XMM0_Qa;
  dVar3 = zabs2(z);
  local_70 = 0.0;
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    z_00._M_value._8_8_ = pdVar1;
    z_00._M_value._0_8_ = pcVar2;
    local_28 = zabs2(z_00);
    z_01._M_value._8_8_ = pdVar1;
    z_01._M_value._0_8_ = pcVar2;
    dVar3 = zabs2(z_01);
    local_28 = dVar3 + local_28;
    z_02._M_value._8_8_ = pdVar1;
    z_02._M_value._0_8_ = pcVar2;
    local_30 = zabs2(z_02);
    local_30 = local_30 * local_30;
    z_03._M_value._8_8_ = pdVar1;
    z_03._M_value._0_8_ = pcVar2;
    dVar3 = zabs2(z_03);
    local_28 = SQRT(dVar3 * dVar3 + local_30) * local_28;
    z_04._M_value._8_8_ = pdVar1;
    z_04._M_value._0_8_ = pcVar2;
    local_40 = zabs2(z_04);
    local_30 = *(double *)ca->_M_value / local_40;
    local_40 = *(double *)(ca->_M_value + 8) / local_40;
    z_05._M_value._8_8_ = pdVar1;
    z_05._M_value._0_8_ = pcVar2;
    dVar3 = zabs2(z_05);
    *z._M_value._8_8_ = dVar3 / local_28;
    local_68 = local_38;
    local_60 = CONCAT44(uStack_54,local_58) ^ 0x8000000000000000;
    local_78 = local_30;
    local_70 = local_40;
    std::complex<double>::operator*=((complex<double> *)&local_78,(complex<double> *)&local_68);
    local_78 = local_78 / local_28;
    local_70 = local_70 / local_28;
    local_38 = local_30 * local_28;
    local_40 = local_40 * local_28;
  }
  else {
    *z._M_value._8_8_ = 0.0;
    local_78 = 1.0;
    local_40 = (double)CONCAT44(uStack_54,local_58);
  }
  *cb._M_value._8_8_ = local_78;
  cb._M_value._8_8_[1] = local_70;
  *(double *)ca->_M_value = local_38;
  *(double *)(ca->_M_value + 8) = local_40;
  return;
}

Assistant:

void zrotg ( complex <double> *ca, complex <double> cb, double *c,
  complex <double> *s )

//****************************************************************************80
//
//  Purpose:
//
//    ZROTG determines a complex <double> Givens rotation.
//
//  Discussion:
//
//    This routine uses double precision complex arithmetic.
//
//    Given values A and B, this routine computes:
//
//    If A = 0:
//
//      R = B
//      C = 0
//      S = (1,0).
//
//    If A /= 0:
//
//      ALPHA = A / abs ( A )
//      NORM  = sqrt ( ( abs ( A ) )^2 + ( abs ( B ) )^2 )
//      R     = ALPHA * NORM
//      C     = abs ( A ) / NORM
//      S     = ALPHA * conj ( B ) / NORM
//
//    In either case, the computed numbers satisfy the equation:
//
//    (         C    S ) * ( A ) = ( R )
//    ( -conj ( S )  C )   ( B ) = ( 0 )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    31 March 2007
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for FORTRAN usage,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, pages 308-323, 1979.
//
//  Parameters:
//
//    Input/output, complex <double> *CA, on input, the value A.  On output,
//    the value R.
//
//    Input, complex <double> CB, the value B.
//
//    Output, double *C, the cosine of the Givens rotation.
//
//    Output, complex <double> *S, the sine of the Givens rotation.
//
{
  complex <double> alpha;
  double norm;
  double scale;

  if ( zabs2 ( *ca ) == 0.0 )
  {
    *c = 0.0;
    *s = complex <double> ( 1.0, 0.0 );
    *ca = cb;
  }
  else
  {
    scale = zabs2 ( *ca ) + zabs2 ( cb );
    norm = scale * sqrt ( pow ( zabs2 ( *ca / scale ), 2 )
                        + pow ( zabs2 (  cb / scale ), 2 ) );
    alpha = *ca / zabs2 ( *ca );
    *c = zabs2 ( *ca ) / norm;
    *s = alpha * conj ( cb ) / norm;
    *ca = alpha * norm;
  }

  return;
}